

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QVariant>>
                 (QDebug *debug,char *which,QList<QVariant> *c)

{
  bool bVar1;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  QList<QVariant> *in_stack_ffffffffffffff80;
  QDebug local_40;
  char *in_stack_ffffffffffffffc8;
  const_iterator t;
  QDebug local_30;
  QVariant *local_28;
  const_iterator local_20;
  const_iterator local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RSI,in_stack_ffffffffffffffc8);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  local_18.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QVariant>::begin(in_stack_ffffffffffffff80);
  local_20.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QVariant *)QList<QVariant>::end(in_stack_ffffffffffffff80);
  local_20 = (const_iterator)local_28;
  bVar1 = QList<QVariant>::const_iterator::operator!=(&local_18,(const_iterator)local_28);
  if (bVar1) {
    QList<QVariant>::const_iterator::operator*(&local_18);
    ::operator<<(in_RSI,(QVariant *)in_RDI);
    QDebug::~QDebug(&local_30);
    QList<QVariant>::const_iterator::operator++(&local_18);
  }
  while (t.i = local_20.i, bVar1 = QList<QVariant>::const_iterator::operator!=(&local_18,local_20),
        bVar1) {
    in_stack_ffffffffffffff80 = (QList<QVariant> *)QDebug::operator<<(in_RSI,(char *)t.i);
    QList<QVariant>::const_iterator::operator*(&local_18);
    ::operator<<(in_RSI,(QVariant *)in_RDI);
    QDebug::~QDebug(&local_40);
    QList<QVariant>::const_iterator::operator++(&local_18);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff80,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}